

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::RegisterTests
          (ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest> *this)

{
  code *pcVar1;
  TestMetaFactoryBase<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
  *pTVar2;
  char *name;
  _Alloc_hider test_suite_name_00;
  _Alloc_hider value_param;
  bool bVar3;
  int iVar4;
  int iVar5;
  pointer __lhs;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 *puVar6;
  ostream *poVar7;
  size_type sVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  pointer psVar9;
  tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>
  *value;
  size_type index;
  ulong uVar10;
  bool bVar11;
  GTestLog local_1b8;
  int local_1b4;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>_*,_false>
  local_1b0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1a8;
  char *local_1a0;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::TestInfo>
  test_info;
  string local_188;
  long local_160;
  ParamGenerator<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
  generator;
  string param_name;
  string test_suite_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 local_a8;
  string local_a0;
  CodeLocation local_80;
  CodeLocation local_58;
  undefined4 extraout_var_01;
  
  psVar9 = (this->tests_).
           super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::TestInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar11 = false;
  do {
    if (psVar9 == (this->tests_).
                  super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::TestInfo>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      if (!bVar11) {
        iVar4 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [2])(this);
        CodeLocation::CodeLocation(&local_58,&this->code_location_);
        InsertSyntheticTestCase
                  ((string *)CONCAT44(extraout_var_06,iVar4),&local_58,
                   (this->tests_).
                   super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::TestInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_start !=
                   (this->tests_).
                   super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::TestInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::__cxx11::string::~string((string *)&local_58);
      }
      return;
    }
    test_info.
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (psVar9->
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count
              (&test_info.
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               &(psVar9->
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount);
    for (__lhs = (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __lhs != (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
      (*(code *)__lhs->generator)(&generator);
      pcVar1 = (code *)__lhs->name_func;
      local_1a0 = __lhs->file;
      local_1b4 = __lhs->line;
      test_suite_name._M_dataplus._M_p = (pointer)&test_suite_name.field_2;
      test_suite_name._M_string_length = 0;
      test_suite_name.field_2._M_local_buf[0] = '\0';
      if ((__lhs->name)._M_string_length != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &test_param_names,&__lhs->name,"/");
        std::__cxx11::string::operator=((string *)&test_suite_name,(string *)&test_param_names);
        std::__cxx11::string::~string((string *)&test_param_names);
      }
      std::__cxx11::string::append((string *)&test_suite_name);
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar4 = (*(generator.impl_.
                 super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
      local_1b0._M_head_impl =
           (ParamIteratorInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
            *)CONCAT44(extraout_var,iVar4);
      local_160 = 0;
      while( true ) {
        iVar4 = (*(generator.impl_.
                   super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
        param_name._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_00,iVar4);
        bVar3 = ParamIterator<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
                ::operator!=((ParamIterator<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
                              *)&local_1b0,
                             (ParamIterator<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
                              *)&param_name);
        if (param_name._M_dataplus._M_p != (pointer)0x0) {
          (**(code **)(*(long *)param_name._M_dataplus._M_p + 8))();
        }
        if (!bVar3) break;
        Message::Message((Message *)&local_1a8);
        iVar4 = (*(local_1b0._M_head_impl)->_vptr_ParamIteratorInterface[5])();
        puVar6 = (undefined4 *)CONCAT44(extraout_var_01,iVar4);
        local_188.field_2._M_allocated_capacity = *(undefined8 *)(puVar6 + 4);
        local_188._M_dataplus._M_p._0_4_ = *puVar6;
        local_188._M_dataplus._M_p._4_4_ = puVar6[1];
        local_188._M_string_length._0_4_ = puVar6[2];
        local_188._M_string_length._4_4_ = puVar6[3];
        local_188.field_2._8_8_ = local_160;
        (*pcVar1)(&param_name,&local_188);
        if (param_name._M_string_length == 0) {
          bVar11 = false;
        }
        else {
          for (uVar10 = 0; bVar11 = param_name._M_string_length <= uVar10, !bVar11;
              uVar10 = uVar10 + 1) {
            bVar3 = IsAlNum(param_name._M_dataplus._M_p[uVar10]);
            if ((!bVar3) && (param_name._M_dataplus._M_p[uVar10] != '_')) break;
          }
        }
        bVar11 = IsTrue(bVar11);
        if (!bVar11) {
          GTestLog::GTestLog((GTestLog *)&local_188,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x246);
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "Condition IsValidParamName(param_name) failed. ");
          poVar7 = std::operator<<(poVar7,"Parameterized test name \'");
          poVar7 = std::operator<<(poVar7,(string *)&param_name);
          poVar7 = std::operator<<(poVar7,"\' is invalid, in ");
          poVar7 = std::operator<<(poVar7,local_1a0);
          poVar7 = std::operator<<(poVar7," line ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1b4);
          std::endl<char,std::char_traits<char>>(poVar7);
          GTestLog::~GTestLog((GTestLog *)&local_188);
        }
        sVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&test_param_names,&param_name);
        bVar11 = IsTrue(sVar8 == 0);
        if (!bVar11) {
          GTestLog::GTestLog((GTestLog *)&local_188,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x24a);
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar7 = std::operator<<(poVar7,"Duplicate parameterized test name \'");
          poVar7 = std::operator<<(poVar7,(string *)&param_name);
          poVar7 = std::operator<<(poVar7,"\', in ");
          poVar7 = std::operator<<(poVar7,local_1a0);
          poVar7 = std::operator<<(poVar7," line ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_1b4);
          std::endl<char,std::char_traits<char>>(poVar7);
          GTestLog::~GTestLog((GTestLog *)&local_188);
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&test_param_names,&param_name);
        if (((test_info.
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->test_base_name)._M_string_length != 0) {
          std::operator<<((ostream *)(local_1a8._M_head_impl + 0x10),
                          (string *)
                          &(test_info.
                            super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->test_base_name);
          std::operator<<((ostream *)(local_1a8._M_head_impl + 0x10),"/");
        }
        std::operator<<((ostream *)(local_1a8._M_head_impl + 0x10),(string *)&param_name);
        test_suite_name_00 = test_suite_name._M_dataplus;
        Message::GetString_abi_cxx11_(&local_188,(Message *)&local_1a8);
        name = (char *)CONCAT44(local_188._M_dataplus._M_p._4_4_,local_188._M_dataplus._M_p._0_4_);
        iVar4 = (*(local_1b0._M_head_impl)->_vptr_ParamIteratorInterface[5])();
        PrintToString<std::tuple<int,int,void(*)(short*,unsigned_char_const*,int,int,int,int),void(*)(short*,unsigned_char_const*,int,int,int,int)>>
                  (&local_a0,(testing *)CONCAT44(extraout_var_02,iVar4),value);
        value_param._M_p = local_a0._M_dataplus._M_p;
        CodeLocation::CodeLocation
                  (&local_80,
                   &(test_info.
                     super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->code_location);
        iVar4 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
                  [3])(this);
        bVar11 = IsTrue(true);
        if (!bVar11) {
          GTestLog::GTestLog(&local_1b8,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x20e);
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "Condition !test_case_fp || !test_suite_fp failed. ");
          poVar7 = std::operator<<(poVar7,
                                   "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                                  );
          poVar7 = std::operator<<(poVar7,local_1a0);
          poVar7 = std::operator<<(poVar7,":");
          std::ostream::operator<<(poVar7,local_1b4);
          GTestLog::~GTestLog(&local_1b8);
        }
        bVar11 = IsTrue(true);
        if (!bVar11) {
          GTestLog::GTestLog(&local_1b8,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x223);
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "Condition !test_case_fp || !test_suite_fp failed. ");
          poVar7 = std::operator<<(poVar7,
                                   "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                                  );
          poVar7 = std::operator<<(poVar7,local_1a0);
          poVar7 = std::operator<<(poVar7,":");
          std::ostream::operator<<(poVar7,local_1b4);
          GTestLog::~GTestLog(&local_1b8);
        }
        pTVar2 = ((test_info.
                   super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->test_meta_factory)._M_t.
                 super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>_*,_false>
                 ._M_head_impl;
        iVar5 = (*(local_1b0._M_head_impl)->_vptr_ParamIteratorInterface[5])();
        puVar6 = (undefined4 *)CONCAT44(extraout_var_04,iVar5);
        local_a8 = *(undefined8 *)(puVar6 + 4);
        local_b8 = *puVar6;
        uStack_b4 = puVar6[1];
        uStack_b0 = puVar6[2];
        uStack_ac = puVar6[3];
        iVar5 = (*pTVar2->_vptr_TestMetaFactoryBase[2])(pTVar2,&local_b8);
        MakeAndRegisterTestInfo
                  (test_suite_name_00._M_p,name,(char *)0x0,value_param._M_p,&local_80,
                   (TypeId)CONCAT44(extraout_var_03,iVar4),(SetUpTestSuiteFunc)0x0,
                   (TearDownTestSuiteFunc)0x0,(TestFactoryBase *)CONCAT44(extraout_var_05,iVar5));
        std::__cxx11::string::~string((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::~string((string *)&param_name);
        if (local_1a8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_1a8._M_head_impl + 8))();
        }
        (*(local_1b0._M_head_impl)->_vptr_ParamIteratorInterface[3])();
        local_160 = local_160 + 1;
        bVar11 = true;
      }
      if (local_1b0._M_head_impl !=
          (ParamIteratorInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>
           *)0x0) {
        (*(local_1b0._M_head_impl)->_vptr_ParamIteratorInterface[1])();
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&test_param_names);
      std::__cxx11::string::~string((string *)&test_suite_name);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&generator.impl_.
                  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<std::tuple<int,_int,_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int),_void_(*)(short_*,_const_unsigned_char_*,_int,_int,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&test_info.
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::IntProRowTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    psVar9 = psVar9 + 1;
  } while( true );
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin();
           gen_it != instantiations_.end(); ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name =
              name_func(TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }    // for gen_it
    }      // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }